

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdmp.cc
# Opt level: O2

void printStack(ostream *os,shared_ptr<pstack::Procman::Process> *proc,hdbg_info *info,void **frames
               )

{
  bool *this;
  undefined8 uVar1;
  string *psVar2;
  ostream *poVar3;
  type *file;
  string *psVar4;
  ulong uVar5;
  char *pcVar6;
  undefined1 local_f0 [8];
  optional<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  found;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  string *local_a0;
  string *local_98;
  undefined1 local_88 [8];
  __shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2> local_80;
  long local_68;
  shared_ptr<pstack::Dwarf::Info> dwarf;
  
  dwarf.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)info;
  for (uVar5 = 0;
      (uVar5 < *(ulong *)(dwarf.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 0x88) && (frames[uVar5] != (void *)0x0));
      uVar5 = uVar5 + 1) {
    pstack::Procman::Process::findSegment((ulong)local_88);
    poVar3 = std::operator<<(os,"\t");
    std::ostream::_M_insert<void_const*>(poVar3);
    if (local_80._M_ptr != (element_type *)0x0) {
      pstack::Elf::Object::findSymbolByAddress_abi_cxx11_((ulong)local_f0,(int)local_80._M_ptr);
      if (found.
          super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_payload._48_1_ == '\x01') {
        poVar3 = std::operator<<(os,"\t");
        poVar3 = std::operator<<(poVar3,(string *)
                                        ((long)&found.
                                                super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                                                ._M_payload.
                                                super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                                                .
                                                super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_payload._M_value.first + 0x10));
        poVar3 = std::operator<<(poVar3,"+");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      }
      uVar1 = *(undefined8 *)
               ((proc->super___shared_ptr<pstack::Procman::Process,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr + 0xa0);
      this = &found.
              super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_engaged;
      std::__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2> *)this,&local_80);
      pstack::Context::getDwarf(&local_68,uVar1,this);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8);
      if (local_68 != 0) {
        pstack::Dwarf::Info::sourceFromAddr_abi_cxx11_((ulong)&local_a0);
        psVar2 = local_98;
        pcVar6 = "in";
        for (psVar4 = local_a0; psVar4 != psVar2; psVar4 = psVar4 + 0x28) {
          poVar3 = std::operator<<(os," ");
          poVar3 = std::operator<<(poVar3,pcVar6);
          poVar3 = std::operator<<(poVar3," ");
          poVar3 = std::operator<<(poVar3,psVar4);
          poVar3 = std::operator<<(poVar3,":");
          std::ostream::operator<<((ostream *)poVar3,*(int *)(psVar4 + 0x20));
          pcVar6 = ",";
        }
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)&local_a0);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&dwarf);
      std::
      _Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_reset((_Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_f0);
    }
    std::operator<<(os,"\n");
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  }
  std::operator<<(os,"\n");
  return;
}

Assistant:

void printStack(std::ostream &os, std::shared_ptr<Procman::Process> &proc, const hdbg_info &info, void **frames) {
   for (size_t i = 0; i < info.maxframes && frames[i] != nullptr; ++i) {
      uintptr_t frameip = uintptr_t(frames[i]);
      if (i != 0)
         frameip--;

      // find the segment containing the instruction pointer.
      auto &&[elfReloc, elf, phdr] = proc->findSegment(frameip);

      os << "\t" << frames[i];
      if (elf) {
         auto found = elf->findSymbolByAddress(frameip - elfReloc, STT_FUNC);
         if (found) {
            auto &[ sym, name ] = *found;
            os << "\t" << name << "+" << uintptr_t(frames[i]) - elfReloc - sym.st_value;
         }

         auto dwarf = proc->context.getDwarf(elf);
         if (dwarf) {
            auto sep = "in";
            for (auto &&[file, line] : dwarf->sourceFromAddr(frameip - elfReloc)) {
               os << " " << sep << " " << file << ":" << line;
               sep = ",";
            }
         }

      }
      os << "\n";
   }
   os << "\n";
}